

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O1

void __thiscall MDIOAnalyzer::ProcessOpcodeFrame(MDIOAnalyzer *this)

{
  long lVar1;
  DataBuilder opcode;
  BitState bit1;
  BitState bit0;
  Frame frame;
  U64 value;
  DataBuilder aDStack_58 [8];
  BitState local_50;
  BitState local_4c;
  long local_48;
  undefined8 local_40;
  char local_28;
  char local_27;
  undefined8 local_20;
  
  lVar1 = AnalyzerChannelData::GetSampleNumber();
  GetBit(this,&local_4c,&this->mMdcPosedgeArrows);
  GetBit(this,&local_50,&this->mMdcPosedgeArrows);
  DataBuilder::DataBuilder(aDStack_58);
  local_20 = 0;
  DataBuilder::Reset((ulonglong *)aDStack_58,(ShiftOrder)&local_20,0);
  DataBuilder::AddBit((BitState)aDStack_58);
  DataBuilder::AddBit((BitState)aDStack_58);
  Frame::Frame((Frame *)&local_48);
  local_48 = lVar1 + 1;
  if ((this->mCurrentPacket).clause == MDIO_C22_PACKET) {
    switch(local_20) {
    case 0:
      local_28 = '\x13';
      break;
    case 1:
      goto switchD_00105ef2_caseD_1;
    case 2:
      goto switchD_00105ef2_caseD_3;
    case 3:
      local_28 = '\x13';
      goto LAB_00105f53;
    default:
      goto switchD_00105ef2_default;
    }
LAB_00105f37:
    (this->mCurrentPacket).operation = MDIO_PACKET_WRITE;
  }
  else {
    (this->mCurrentPacket).c45Type = MDIO_C45_PACKET_DATA;
    (this->mCurrentPacket).operation = MDIO_PACKET_WRITE;
    switch(local_20) {
    case 0:
      local_28 = '\x04';
      (this->mCurrentPacket).c45Type = MDIO_C45_PACKET_ADDR;
      (this->mCurrentPacket).operation = MDIO_PACKET_WRITE;
      goto LAB_00105f5a;
    case 1:
switchD_00105ef2_caseD_1:
      local_28 = '\x02';
      goto LAB_00105f37;
    case 2:
      local_28 = '\x05';
      break;
    case 3:
switchD_00105ef2_caseD_3:
      local_28 = '\x03';
      break;
    default:
switchD_00105ef2_default:
      local_28 = '\x13';
      goto LAB_00105f5a;
    }
LAB_00105f53:
    (this->mCurrentPacket).operation = MDIO_PACKET_READ;
  }
LAB_00105f5a:
  local_27 = (local_28 == '\x13') << 7;
  local_40 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
  Analyzer::ReportProgress((ulonglong)this);
  Frame::~Frame((Frame *)&local_48);
  DataBuilder::~DataBuilder(aDStack_58);
  return;
}

Assistant:

void MDIOAnalyzer::ProcessOpcodeFrame()
{
    // starting sample of the start frame
    U64 starting_sample = mMdio->GetSampleNumber() + 1;

    // get the value of the two bits of the start frame
    BitState bit0, bit1;
    GetBit( bit0, mMdcPosedgeArrows ); // sample first bit
    GetBit( bit1, mMdcPosedgeArrows ); // sample second bit

    // reconstruct the opcode
    DataBuilder opcode;
    U64 value = 0;
    opcode.Reset( &value, AnalyzerEnums::MsbFirst, 2 );
    opcode.AddBit( bit0 );
    opcode.AddBit( bit1 );

    // create and set the opcode frame
    Frame frame;

    if( mCurrentPacket.clause == MDIO_C22_PACKET )
    {
        switch( value )
        {
        case C45_ADDRESS:
            frame.mType = MDIO_UNKNOWN; // Clause 22 opcode cannot be C45_ADDRESS (00)
            mCurrentPacket.operation = MDIO_PACKET_WRITE;
            break;
        case C22_WRITE:
            frame.mType = MDIO_OP_W;
            mCurrentPacket.operation = MDIO_PACKET_WRITE;
            break;
        case C22_READ:
            frame.mType = MDIO_OP_R;
            mCurrentPacket.operation = MDIO_PACKET_READ;
            break;
        case C45_READ:
            frame.mType = MDIO_UNKNOWN; // Clause 22 opcode cannot be C45_READ (11)
            mCurrentPacket.operation = MDIO_PACKET_READ;
            break;
        default:
            frame.mType = MDIO_UNKNOWN;
        }
    }
    else // mCurrentPacket.clause == MDIO_C45_PACKET
    {
        mCurrentPacket.c45Type = MDIO_C45_PACKET_DATA;
        mCurrentPacket.operation = MDIO_PACKET_WRITE;

        switch( value )
        {
        case C45_ADDRESS:
            frame.mType = MDIO_C45_OP_ADDR;
            mCurrentPacket.c45Type = MDIO_C45_PACKET_ADDR;
            mCurrentPacket.operation = MDIO_PACKET_WRITE;
            break;
        case C45_WRITE:
            frame.mType = MDIO_OP_W;
            mCurrentPacket.operation = MDIO_PACKET_WRITE;
            break;
        case C45_READ_AND_ADDR:
            frame.mType = MDIO_C45_OP_READ_INC_ADDR;
            mCurrentPacket.operation = MDIO_PACKET_READ;
            break;
        case C45_READ:
            frame.mType = MDIO_OP_R;
            mCurrentPacket.operation = MDIO_PACKET_READ;
            break;
        default:
            frame.mType = MDIO_UNKNOWN;
        }
    }

    if( frame.mType == MDIO_UNKNOWN )
    {
        frame.mFlags = DISPLAY_AS_ERROR_FLAG;
    }
    else
    {
        frame.mFlags = 0;
    }

    frame.mStartingSampleInclusive = starting_sample;
    frame.mEndingSampleInclusive = mMdio->GetSampleNumber();

    mResults->AddFrame( frame );
    ReportProgress( frame.mEndingSampleInclusive );
}